

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O0

char * FIX::integer_to_string<signed_char>(char *buf,size_t len,char t)

{
  uint uVar1;
  byte local_29;
  unsigned_int pos;
  type number;
  char *p;
  bool isNegative;
  char t_local;
  size_t len_local;
  char *buf_local;
  
  local_29 = _UNSIGNED_VALUE_OF<signed_char>(t);
  _pos = buf + len;
  while (99 < local_29) {
    uVar1 = (uint)local_29;
    local_29 = local_29 / 100;
    _pos[-1] = digit_pairs[(uVar1 % 100) * 2 + 1];
    _pos[-2] = digit_pairs[uVar1 % 100 << 1];
    _pos = _pos + -2;
  }
  if (local_29 < 10) {
    _pos[-1] = local_29 + 0x30;
    _pos = _pos + -1;
  }
  else {
    _pos[-1] = digit_pairs[(int)((uint)local_29 * 2 + 1)];
    _pos[-2] = digit_pairs[(int)((uint)local_29 << 1)];
    _pos = _pos + -2;
  }
  if (t < '\0') {
    _pos[-1] = '-';
    _pos = _pos + -1;
  }
  return _pos;
}

Assistant:

inline char *integer_to_string(char *buf, const size_t len, const T t) {
  const bool isNegative = t < 0;
  char *p = buf + len;

  typename std::make_unsigned<T>::type number = UNSIGNED_VALUE_OF(t);

  while (number > 99) {
    unsigned_int pos = number % 100;
    number /= 100;

    *--p = digit_pairs[2 * pos + 1];
    *--p = digit_pairs[2 * pos];
  }

  if (number > 9) {
    *--p = digit_pairs[2 * number + 1];
    *--p = digit_pairs[2 * number];
  } else {
    *--p = '0' + char(number);
  }

  if (isNegative) {
    *--p = '-';
  }

  return p;
}